

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

PropertyIdArray *
Js::InterpreterStackFrame::OP_NewPropIdArrForCompProps(uint32 size,ScriptContext *scriptContext)

{
  Recycler *alloc;
  PropertyIdArray *pPVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if (size < 0x40000000) {
    data.typeinfo = (type_info *)(ulong)(size * 4);
    local_40 = (undefined1  [8])&PropertyIdArray::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4aa05e8;
    data.filename._0_4_ = 0x167c;
    alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_40);
    pPVar1 = (PropertyIdArray *)new<Memory::Recycler>(8,alloc,0x37fe86,0);
    pPVar1->count = size;
    pPVar1->extraSlots = '\0';
    pPVar1->hadDuplicates = false;
    pPVar1->has__proto__ = false;
    pPVar1->hasNonSimpleParams = false;
    return pPVar1;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

Js::PropertyIdArray * InterpreterStackFrame::OP_NewPropIdArrForCompProps(uint32 size, ScriptContext* scriptContext)
    {
        uint extraAlloc = UInt32Math::Mul(size, sizeof(Js::PropertyId));
        Js::PropertyIdArray * propIdArr = RecyclerNewPlusLeaf(scriptContext->GetRecycler(), extraAlloc, Js::PropertyIdArray, size, 0);
        return propIdArr;
    }